

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar18;
  pointer pMVar13;
  int *piVar14;
  void *pvVar15;
  Allocator *pAVar16;
  size_t sVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 (*pauVar28) [64];
  bool bVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  Layer *pLVar33;
  _func_int **pp_Var34;
  long lVar35;
  long lVar36;
  byte bVar37;
  pointer pMVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  byte bVar42;
  uint uVar43;
  pointer pMVar44;
  undefined1 (*pauVar45) [64];
  ulong uVar46;
  undefined1 (*pauVar47) [64];
  int k;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  undefined1 (*pauVar55) [32];
  uint uVar56;
  uint uVar57;
  long lVar58;
  long lVar59;
  undefined1 (*pauVar60) [16];
  int iVar61;
  undefined1 (*pauVar62) [16];
  _func_int **pp_Var63;
  long lVar64;
  _func_int **pp_Var65;
  _func_int **pp_Var66;
  uint uVar67;
  int iVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  int iVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  long lVar77;
  long lVar78;
  undefined8 uVar79;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  ulong local_398;
  uint local_378;
  long local_358;
  long local_350;
  long local_340;
  long local_328;
  long local_318;
  long local_310;
  ParamDict pd;
  Allocator *local_2e8;
  int iStack_2e0;
  int iStack_2dc;
  undefined8 uStack_2d8;
  int local_2d0 [2];
  size_t local_2c8;
  void *local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  size_t local_2b0;
  int local_2a8;
  Allocator *local_2a0;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined8 uStack_290;
  int local_288;
  size_t local_280;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 local_248;
  long local_240;
  int TILE_M;
  ParamDict pd_5;
  size_t local_218;
  Allocator *local_208;
  int local_200;
  int iStack_1fc;
  undefined8 uStack_1f8;
  int local_1f0;
  size_t local_1e8;
  long local_1e0;
  long local_1d8;
  int TILE_K;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  Mat *local_100;
  long local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  long local_40;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar33 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 2:
    pLVar33 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 3:
    pLVar33 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 4:
    pLVar33 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 5:
    pLVar33 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 6:
    pLVar33 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  default:
    pLVar33 = (Layer *)0x0;
    goto LAB_0017c5c7;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar33->_vptr_Layer[4])(pLVar33);
LAB_0017c5c7:
  this->activation = pLVar33;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar12 = (this->super_Convolution).kernel_w;
  uVar18 = (this->super_Convolution).kernel_h;
  auVar104._4_4_ = uVar18;
  auVar104._0_4_ = uVar12;
  uVar46 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar18 * uVar12);
  uVar7 = (this->super_Convolution).num_output;
  uVar46 = (long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
           (long)(int)uVar7;
  iVar61 = (int)uVar46;
  if (uVar12 == uVar18 && opt->use_packing_layout == false) {
    auVar21._0_4_ = (this->super_Convolution).dilation_w;
    auVar21._4_4_ = (this->super_Convolution).dilation_h;
    auVar21._8_4_ = (this->super_Convolution).stride_w;
    auVar21._12_4_ = (this->super_Convolution).stride_h;
    auVar105._4_4_ = auVar21._0_4_;
    auVar105._0_4_ = auVar21._0_4_;
    auVar105._8_4_ = auVar21._0_4_;
    auVar105._12_4_ = auVar21._0_4_;
    auVar107._8_4_ = 1;
    auVar107._0_8_ = 0x100000001;
    auVar107._12_4_ = 1;
    auVar105 = vpblendd_avx2(auVar107,auVar105,2);
    uVar51 = vpcmpd_avx512vl(auVar21,auVar105,4);
    uVar76 = vpcmpeqd_avx512vl(auVar21,auVar105);
    auVar21 = vpmovm2d_avx512vl(uVar51 & 0xf);
    auVar105 = vpmovm2d_avx512vl(uVar76 & 0xf);
    auVar21 = vpblendd_avx2(auVar105,auVar21,1);
    uVar79 = vpmovd2m_avx512vl(auVar21);
    if ((~(ushort)uVar79 & 0xf) == 0) {
      pLVar33 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar33;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_2c8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_2e8 = (Allocator *)0x0;
        iStack_2e0 = 0;
        iStack_2dc = 0;
        uStack_2d8._0_4_ = 0;
        uStack_2d8._4_4_ = 0;
        local_2d0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar14 = (this->super_Convolution).weight_data.refcount;
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar14 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar14,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar14 >> 0x20);
          local_2e8 = (this->super_Convolution).weight_data.allocator;
          uVar26 = (this->super_Convolution).weight_data.dims;
          uVar27 = (this->super_Convolution).weight_data.w;
          uStack_2d8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_2d8._4_4_ = (this->super_Convolution).weight_data.d;
          local_2d0[0] = (this->super_Convolution).weight_data.c;
          local_2c8 = (this->super_Convolution).weight_data.cstep;
          iStack_2e0 = uVar26;
          iStack_2dc = uVar27;
        }
        pLVar33 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_2e8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_2e8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_2c8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_2e8 = (Allocator *)0x0;
        iStack_2e0 = 0;
        iStack_2dc = 0;
        uStack_2d8._0_4_ = 0;
        uStack_2d8._4_4_ = 0;
        local_2d0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar14 = (this->super_Convolution).weight_data.refcount;
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar14 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar14,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar14 >> 0x20);
          local_2e8 = (this->super_Convolution).weight_data.allocator;
          uVar22 = (this->super_Convolution).weight_data.dims;
          uVar23 = (this->super_Convolution).weight_data.w;
          uStack_2d8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_2d8._4_4_ = (this->super_Convolution).weight_data.d;
          local_2d0[0] = (this->super_Convolution).weight_data.c;
          local_2c8 = (this->super_Convolution).weight_data.cstep;
          iStack_2e0 = uVar22;
          iStack_2dc = uVar23;
        }
        local_280 = 0;
        local_288 = 0;
        uStack_290 = 0;
        uStack_294 = 0;
        uStack_298 = 0;
        local_2a0 = (Allocator *)0x0;
        local_2a8 = 0;
        local_2b0 = 0;
        uStack_2b4 = 0;
        uStack_2b8 = 0;
        local_2c0 = (void *)0x0;
        if ((Mat *)&local_2c0 != &(this->super_Convolution).bias_data) {
          piVar14 = (this->super_Convolution).bias_data.refcount;
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + 1;
            UNLOCK();
          }
          local_2c0 = (this->super_Convolution).bias_data.data;
          piVar14 = (this->super_Convolution).bias_data.refcount;
          uStack_2b8 = SUB84(piVar14,0);
          uStack_2b4 = (undefined4)((ulong)piVar14 >> 0x20);
          local_2b0 = (this->super_Convolution).bias_data.elemsize;
          local_2a8 = (this->super_Convolution).bias_data.elempack;
          local_2a0 = (this->super_Convolution).bias_data.allocator;
          uVar24 = (this->super_Convolution).bias_data.dims;
          uVar25 = (this->super_Convolution).bias_data.w;
          uStack_290._0_4_ = (this->super_Convolution).bias_data.h;
          uStack_290._4_4_ = (this->super_Convolution).bias_data.d;
          local_288 = (this->super_Convolution).bias_data.c;
          local_280 = (this->super_Convolution).bias_data.cstep;
          uStack_298 = uVar24;
          uStack_294 = uVar25;
        }
        pLVar33 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar52 = 0x48;
        do {
          piVar14 = *(int **)((long)&pd.d + lVar52);
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (*piVar14 == 0) {
              pvVar15 = *(void **)((long)&pd._vptr_ParamDict + lVar52);
              if (*(long **)((long)&local_2e8 + lVar52) == (long *)0x0) {
                if (pvVar15 != (void *)0x0) {
                  free(pvVar15);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_2e8 + lVar52) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_2c8 + lVar52) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar52 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar52) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_2e0 + lVar52) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_2d0 + lVar52) = 0;
          lVar52 = lVar52 + -0x48;
        } while (lVar52 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar14 = (this->super_Convolution).weight_data.refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar15 = (this->super_Convolution).weight_data.data;
            pAVar16 = (this->super_Convolution).weight_data.allocator;
            if (pAVar16 == (Allocator *)0x0) {
              if (pvVar15 != (void *)0x0) {
                free(pvVar15);
              }
            }
            else {
              (*pAVar16->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar43 = 1;
  uVar71 = 1;
  if (opt->use_packing_layout != false) {
    uVar71 = 0x10;
    uVar43 = 0x10;
    if ((uVar46 & 0xf) != 0) {
      if ((uVar46 & 7) == 0) {
        uVar43 = 8;
      }
      else {
        uVar43 = (uint)((uVar46 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar7 & 0xf) != 0) {
      if ((uVar7 & 7) == 0) {
        uVar71 = 8;
      }
      else {
        uVar71 = (uint)((uVar7 & 3) == 0) * 3 + 1;
      }
    }
  }
  bVar42 = opt->use_winograd23_convolution;
  if ((((bool)bVar42 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar29 = false;
  }
  else {
    bVar29 = 8 < (int)uVar7 || 8 < iVar61;
  }
  auVar19._0_4_ = (this->super_Convolution).dilation_w;
  auVar19._4_4_ = (this->super_Convolution).dilation_h;
  auVar19._8_4_ = (this->super_Convolution).stride_w;
  auVar19._12_4_ = (this->super_Convolution).stride_h;
  auVar104._8_8_ = 0;
  auVar104 = vpunpcklqdq_avx(auVar104,auVar19);
  if (((auVar104 == _DAT_005a64c0) && ((this->super_Convolution).stride_w == 1)) &&
     (((this->super_Convolution).stride_h == 1 &&
      ((opt->use_winograd_convolution != false && (bVar29)))))) {
    pMVar13 = (this->super_Convolution).super_Layer.bottom_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((pMVar13 ==
          (this->super_Convolution).super_Layer.bottom_shapes.
          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
          _M_finish) || (pMVar13->w == 0)) || (pMVar13->h == 0)) {
      pMVar38 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar44 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (((pMVar38 != pMVar44) && (pMVar38->w != 0)) && (pMVar38->h != 0)) goto LAB_0017caef;
      if ((((int)uVar7 < 0x21) && (opt->use_winograd63_convolution != false)) && (iVar61 < 0x21)) {
LAB_0017d209:
        conv3x3s1_winograd63_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,iVar61,uVar7
                   ,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_0017cfc1;
LAB_0017cf8a:
        conv3x3s1_winograd43_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,iVar61,uVar7
                   ,opt);
      }
    }
    else {
      pMVar38 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar44 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
LAB_0017caef:
      if (((pMVar38 == pMVar44) || (iVar72 = pMVar38->w, iVar72 == 0)) ||
         (iVar68 = pMVar38->h, iVar68 == 0)) {
        iVar72 = pMVar13->w;
        iVar68 = pMVar13->h;
        iVar8 = (this->super_Convolution).pad_left;
        iVar9 = (this->super_Convolution).pad_right;
        if (((iVar9 < 1 && iVar8 < 1) && (iVar10 = (this->super_Convolution).pad_top, iVar10 < 1))
           && (iVar11 = (this->super_Convolution).pad_bottom, iVar11 < 1)) {
          if ((iVar11 == -0xe9 && (iVar10 == -0xe9 && (iVar9 == -0xe9 && iVar8 == -0xe9))) ||
             (iVar11 == -0xea && (iVar10 == -0xea && (iVar9 == -0xea && iVar8 == -0xea))))
          goto LAB_0017cb06;
        }
        else {
          iVar72 = iVar8 + iVar72 + iVar9;
          iVar68 = iVar68 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom
          ;
        }
      }
      else {
LAB_0017cb06:
        iVar72 = iVar72 + 2;
        iVar68 = iVar68 + 2;
      }
      bVar30 = test_prefer_winograd63(iVar61,uVar7,iVar72,iVar68);
      bVar29 = test_prefer_winograd23(iVar61,uVar7,iVar72,iVar68);
      bVar37 = bVar29 & bVar42;
      if (!bVar29) {
        bVar42 = bVar30;
      }
      if ((bool)bVar30) {
        bVar31 = opt->use_winograd63_convolution;
        if ((bVar42 & bVar31) == 0) goto LAB_0017cf63;
LAB_0017ceb4:
        if (bVar37 == 0) goto LAB_0017d202;
      }
      else {
        if (bVar42 != 0) goto LAB_0017ceb4;
        bVar31 = 0;
LAB_0017cf63:
        if (opt->use_winograd43_convolution == false) {
          if (bVar37 == 0 && opt->use_winograd63_convolution == true) {
            bVar30 = bVar31 | opt->use_winograd63_convolution;
LAB_0017d202:
            if (bVar30 != 0) goto LAB_0017d209;
            goto LAB_0017d224;
          }
        }
        else if (bVar37 == 0) goto LAB_0017cf8a;
      }
LAB_0017cfc1:
      conv3x3s1_winograd23_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,iVar61,uVar7,
                 opt);
    }
LAB_0017d224:
    if (opt->lightmode != true) {
      return 0;
    }
    piVar14 = (this->super_Convolution).weight_data.refcount;
    if (piVar14 == (int *)0x0) goto LAB_0017d276;
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 != 0) goto LAB_0017d276;
    pvVar15 = (this->super_Convolution).weight_data.data;
    pAVar16 = (this->super_Convolution).weight_data.allocator;
  }
  else {
    iVar68 = get_cpu_level2_cache_size();
    uVar7 = (this->super_Convolution).num_output;
    uVar32 = (this->super_Convolution).kernel_w;
    uVar67 = (this->super_Convolution).kernel_h;
    uVar57 = (this->super_Convolution).dilation_w;
    uVar48 = (this->super_Convolution).dilation_h;
    uVar49 = (this->super_Convolution).stride_w;
    iVar72 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar68 < (int)(uVar7 * uVar32 * uVar67 * uVar57 * uVar48 * uVar49 * iVar72 * iVar61 * 8) ||
         (0x10 < iVar61 || 0x10 < (int)uVar7))) || (uVar67 == 1 && uVar32 == 1)) {
      uVar67 = uVar67 * uVar32;
      uVar71 = uVar67 * iVar61;
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar7,0,uVar71,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar43 = (int)(TILE_M + uVar7 + -1) / TILE_M;
      local_398 = 1;
      if (opt->use_packing_layout == true) {
        if ((uVar46 & 0xf) == 0) {
          local_398 = 0x10;
        }
        else if ((uVar46 & 7) == 0) {
          local_398 = 8;
        }
        else {
          local_398 = (ulong)((uint)((uVar46 & 3) == 0) * 3 + 1);
        }
      }
      local_100 = &(this->super_Convolution).weight_data;
      local_2c8 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_2e8 = (Allocator *)0x0;
      iStack_2e0 = 0;
      iStack_2dc = 0;
      uStack_2d8._0_4_ = 0;
      uStack_2d8._4_4_ = 0;
      local_2d0[0] = 0;
      if (uVar67 == 1) {
        Mat::reshape((Mat *)&pd_5,local_100,uVar71,uVar7,(Allocator *)0x0);
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
          UNLOCK();
        }
        piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_2e8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_2e8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = SUB84(pd_5.d,0);
        pd.d._4_4_ = (undefined4)((ulong)pd_5.d >> 0x20);
        local_2e8 = local_208;
        iStack_2e0 = local_200;
        iStack_2dc = iStack_1fc;
        uStack_2d8 = uStack_1f8;
        local_2d0[0] = local_1f0;
        local_2c8 = local_1e8;
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0017d379;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_0017d379;
        if (local_208 != (Allocator *)0x0) {
          (*local_208->_vptr_Allocator[3])();
          goto LAB_0017d379;
        }
      }
      else {
        Mat::reshape((Mat *)&pd_5,local_100,uVar67,iVar61,uVar7,(Allocator *)0x0);
        Mat::create((Mat *)&pd,uVar71,uVar7,4,(Allocator *)0x0);
        if (0 < (int)uVar7) {
          uVar46 = 0;
          do {
            if ((int)local_398 <= iVar61) {
              pp_Var34 = (_func_int **)(local_218 * local_1e8 * uVar46 + (long)pd_5._vptr_ParamDict)
              ;
              lVar52 = 0;
              pp_Var63 = pd._vptr_ParamDict;
              do {
                if (0 < (int)uVar67) {
                  uVar51 = 0;
                  uVar76 = local_398;
                  pp_Var66 = pp_Var34;
                  pp_Var65 = pp_Var34;
                  do {
                    do {
                      *(undefined4 *)pp_Var63 = *(undefined4 *)pp_Var66;
                      pp_Var63 = (_func_int **)((long)pp_Var63 + 4);
                      uVar76 = uVar76 - 1;
                      pp_Var66 = (_func_int **)((long)pp_Var66 + (long)iStack_1fc * local_218);
                    } while (uVar76 != 0);
                    uVar51 = uVar51 + 1;
                    pp_Var66 = (_func_int **)((long)pp_Var65 + 4);
                    uVar76 = local_398;
                    pp_Var65 = pp_Var66;
                  } while (uVar51 != uVar67);
                }
                lVar52 = lVar52 + local_398;
                pp_Var34 = (_func_int **)((long)pp_Var34 + (long)iStack_1fc * local_218 * local_398)
                ;
              } while (lVar52 < (long)((long)iVar61 - (ulong)((int)local_398 - 1)));
            }
            uVar46 = uVar46 + 1;
          } while (uVar46 != uVar7);
        }
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0017d379;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_0017d379;
        if (local_208 != (Allocator *)0x0) {
          (*local_208->_vptr_Allocator[3])();
          goto LAB_0017d379;
        }
      }
      if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
        free(pd_5._vptr_ParamDict);
      }
LAB_0017d379:
      local_110 = (long)TILE_K;
      local_1b8 = (long)TILE_M;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(int)(uVar71 + TILE_K + -1) / TILE_K,
                  (int)((uVar7 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      if (0 < (int)uVar43) {
        local_e0 = (long)(int)uVar71;
        local_f0 = (ulong)uVar43;
        local_e8 = local_110 * 4;
        local_f8 = local_1b8 * 4;
        local_118 = 8;
        local_120 = 0xc;
        local_128 = 0x10;
        local_130 = 0x14;
        local_138 = 0x18;
        local_140 = 0x1c;
        local_148 = 0x20;
        local_150 = 0x24;
        local_158 = 0x3c;
        local_160 = 0x38;
        local_168 = 0x34;
        local_170 = 0x30;
        local_178 = 0x2c;
        local_180 = 0x28;
        local_188 = 7;
        local_190 = 6;
        local_198 = 5;
        local_1a0 = 4;
        local_1d8 = 3;
        local_1e0 = 2;
        local_268 = 1;
        local_270 = 0;
        local_1a8 = 4;
        local_1b0 = 0;
        uVar46 = 0;
        do {
          lVar52 = uVar46 * local_1b8;
          uVar43 = uVar7 - (int)lVar52;
          if ((int)(uint)local_1b8 < (int)uVar43) {
            uVar43 = (uint)local_1b8;
          }
          if (0 < (int)uVar71) {
            local_48 = (ulong)uVar43;
            lVar35 = (long)(int)uVar43;
            local_328 = 0;
            uVar76 = 0;
            uVar32 = uVar71;
            do {
              uVar57 = (uint)local_110;
              uVar67 = uVar32;
              if ((int)uVar57 < (int)uVar32) {
                uVar67 = uVar57;
              }
              uVar48 = uVar71 - (int)uVar76;
              if ((int)uVar57 < (int)uVar48) {
                uVar48 = uVar57;
              }
              sVar17 = (this->weight_sgemm_data).elemsize;
              pauVar47 = (undefined1 (*) [64])
                         ((long)(this->weight_sgemm_data).data +
                         (long)(this->weight_sgemm_data).w * sVar17 *
                         (long)(int)((long)((ulong)(uint)((int)uVar76 >> 0x1f) << 0x20 |
                                           uVar76 & 0xffffffff) / (long)(int)uVar57) +
                         (this->weight_sgemm_data).cstep * uVar46 * sVar17);
              uVar51 = 0;
              lVar36 = (long)iStack_2dc;
              if (0xf < (int)uVar43) {
                local_50 = local_1b0 * lVar36 + local_328;
                local_40 = lVar36 * 0x40;
                local_58 = local_1a8 * lVar36 + local_328;
                local_60 = local_118 * lVar36 + local_328;
                local_68 = local_120 * lVar36 + local_328;
                local_70 = local_128 * lVar36 + local_328;
                local_78 = local_130 * lVar36 + local_328;
                local_80 = local_138 * lVar36 + local_328;
                local_88 = local_140 * lVar36 + local_328;
                local_90 = local_148 * lVar36 + local_328;
                local_98 = local_150 * lVar36 + local_328;
                local_a0 = local_158 * lVar36 + local_328;
                local_a8 = local_160 * lVar36 + local_328;
                local_b0 = local_168 * lVar36 + local_328;
                local_b8 = local_170 * lVar36 + local_328;
                local_c0 = local_178 * lVar36 + local_328;
                local_c8 = local_180 * lVar36 + local_328;
                lVar77 = lVar36 * 4;
                lVar59 = 0;
                uVar41 = 0;
                do {
                  if ((int)uVar48 < 0x10) {
                    local_340 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52) * lVar36 * 4;
                    local_318 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 1) * lVar36 * 4;
                    lVar53 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 2) * lVar36 * 4;
                    local_240 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 3) * lVar36 * 4;
                    local_248 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 4) * lVar36 * 4;
                    local_108 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 5) * lVar36 * 4;
                    lVar75 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 6) * lVar36 * 4;
                    local_250 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 7) * lVar36 * 4;
                    lVar39 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 8) * lVar36 * 4;
                    lVar70 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 9) * lVar36 * 4;
                    lVar64 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 10) * lVar36 * 4;
                    lVar58 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 0xb) * lVar36 * 4;
                    local_258 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 0xc) * lVar36 * 4;
                    local_260 = (long)pd._vptr_ParamDict +
                                uVar76 * 4 + (uVar41 + lVar52 + 0xd) * lVar36 * 4;
                    lVar40 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (uVar41 + lVar52 + 0xe) * lVar36 * 4;
                    lVar78 = (long)pd._vptr_ParamDict +
                             uVar76 * 4 + (lVar52 + uVar41 + 0xf) * lVar36 * 4;
                    uVar49 = 0;
                  }
                  else {
                    lVar64 = (long)pd._vptr_ParamDict + lVar59;
                    iVar61 = 0xf;
                    do {
                      lVar53 = lVar64 + local_50;
                      lVar75 = lVar53 + lVar36 * 8;
                      auVar81 = *(undefined1 (*) [64])(lVar53 + lVar36 * 4);
                      auVar83 = *(undefined1 (*) [64])(lVar53 + lVar36 * 8);
                      auVar84 = *(undefined1 (*) [64])(lVar75 + lVar36 * 4);
                      lVar39 = lVar36 * 8 + lVar75;
                      auVar85 = *(undefined1 (*) [64])(lVar75 + lVar36 * 8);
                      lVar53 = lVar39 + lVar36 * 4;
                      auVar86 = *(undefined1 (*) [64])(lVar39 + lVar36 * 4);
                      auVar87 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar88 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar89 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar90 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar91 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar92 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar93 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar94 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      lVar53 = lVar53 + lVar77;
                      auVar95 = *(undefined1 (*) [64])(lVar77 + lVar53);
                      auVar96 = *(undefined1 (*) [64])(lVar53 + lVar36 * 8);
                      auVar80 = vunpcklps_avx512f(*(undefined1 (*) [64])(lVar64 + local_50),auVar81)
                      ;
                      auVar81 = vunpckhps_avx512f(*(undefined1 (*) [64])(lVar64 + local_50),auVar81)
                      ;
                      auVar82 = vunpcklps_avx512f(auVar83,auVar84);
                      auVar83 = vunpckhps_avx512f(auVar83,auVar84);
                      auVar84 = vunpcklps_avx512f(auVar85,auVar86);
                      auVar85 = vunpckhps_avx512f(auVar85,auVar86);
                      auVar86 = vunpcklps_avx512f(auVar87,auVar88);
                      auVar87 = vunpckhps_avx512f(auVar87,auVar88);
                      auVar88 = vunpcklps_avx512f(auVar89,auVar90);
                      auVar89 = vunpckhps_avx512f(auVar89,auVar90);
                      auVar90 = vunpcklps_avx512f(auVar91,auVar92);
                      auVar91 = vunpckhps_avx512f(auVar91,auVar92);
                      auVar92 = vunpcklps_avx512f(auVar93,auVar94);
                      auVar93 = vunpckhps_avx512f(auVar93,auVar94);
                      auVar94 = vunpcklps_avx512f(auVar95,auVar96);
                      auVar95 = vunpckhps_avx512f(auVar95,auVar96);
                      auVar96 = vunpcklpd_avx512f(auVar80,auVar82);
                      auVar80 = vunpckhpd_avx512f(auVar80,auVar82);
                      auVar82 = vunpcklpd_avx512f(auVar81,auVar83);
                      auVar81 = vunpckhpd_avx512f(auVar81,auVar83);
                      auVar83 = vunpcklpd_avx512f(auVar84,auVar86);
                      auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
                      auVar86 = vunpcklpd_avx512f(auVar85,auVar87);
                      auVar85 = vunpckhpd_avx512f(auVar85,auVar87);
                      auVar87 = vunpcklpd_avx512f(auVar88,auVar90);
                      auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
                      auVar90 = vunpcklpd_avx512f(auVar89,auVar91);
                      auVar89 = vunpckhpd_avx512f(auVar89,auVar91);
                      auVar91 = vunpcklpd_avx512f(auVar92,auVar94);
                      auVar92 = vunpckhpd_avx512f(auVar92,auVar94);
                      auVar94 = vunpcklpd_avx512f(auVar93,auVar95);
                      auVar93 = vunpckhpd_avx512f(auVar93,auVar95);
                      auVar95 = vshuff64x2_avx512f(auVar96,auVar83,0x88);
                      auVar97 = vshuff64x2_avx512f(auVar87,auVar91,0x88);
                      auVar98 = vshuff64x2_avx512f(auVar80,auVar84,0x88);
                      auVar99 = vshuff64x2_avx512f(auVar88,auVar92,0x88);
                      auVar100 = vshuff64x2_avx512f(auVar82,auVar86,0x88);
                      auVar101 = vshuff64x2_avx512f(auVar90,auVar94,0x88);
                      auVar102 = vshuff64x2_avx512f(auVar81,auVar85,0x88);
                      auVar103 = vshuff64x2_avx512f(auVar89,auVar93,0x88);
                      auVar83 = vshuff64x2_avx512f(auVar96,auVar83,0xdd);
                      auVar87 = vshuff64x2_avx512f(auVar87,auVar91,0xdd);
                      auVar84 = vshuff64x2_avx512f(auVar80,auVar84,0xdd);
                      auVar88 = vshuff64x2_avx512f(auVar88,auVar92,0xdd);
                      auVar86 = vshuff64x2_avx512f(auVar82,auVar86,0xdd);
                      auVar90 = vshuff64x2_avx512f(auVar90,auVar94,0xdd);
                      auVar81 = vshuff64x2_avx512f(auVar81,auVar85,0xdd);
                      auVar85 = vshuff64x2_avx512f(auVar89,auVar93,0xdd);
                      auVar89 = vshuff64x2_avx512f(auVar95,auVar97,0x88);
                      auVar91 = vshuff64x2_avx512f(auVar98,auVar99,0x88);
                      auVar92 = vshuff64x2_avx512f(auVar100,auVar101,0x88);
                      auVar93 = vshuff64x2_avx512f(auVar102,auVar103,0x88);
                      auVar94 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
                      auVar96 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
                      auVar80 = vshuff64x2_avx512f(auVar86,auVar90,0x88);
                      auVar82 = vshuff64x2_avx512f(auVar81,auVar85,0x88);
                      auVar95 = vshuff64x2_avx512f(auVar95,auVar97,0xdd);
                      auVar97 = vshuff64x2_avx512f(auVar98,auVar99,0xdd);
                      auVar98 = vshuff64x2_avx512f(auVar100,auVar101,0xdd);
                      auVar99 = vshuff64x2_avx512f(auVar102,auVar103,0xdd);
                      auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
                      auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
                      auVar86 = vshuff64x2_avx512f(auVar86,auVar90,0xdd);
                      auVar81 = vshuff64x2_avx512f(auVar81,auVar85,0xdd);
                      *pauVar47 = auVar89;
                      pauVar47[1] = auVar91;
                      pauVar47[2] = auVar92;
                      pauVar47[3] = auVar93;
                      pauVar47[4] = auVar94;
                      pauVar47[5] = auVar96;
                      pauVar47[6] = auVar80;
                      pauVar47[7] = auVar82;
                      pauVar47[8] = auVar95;
                      pauVar47[9] = auVar97;
                      pauVar47[10] = auVar98;
                      pauVar47[0xb] = auVar99;
                      pauVar47[0xc] = auVar83;
                      pauVar47[0xd] = auVar84;
                      pauVar47[0xe] = auVar86;
                      pauVar47[0xf] = auVar81;
                      pauVar47 = pauVar47 + 0x10;
                      lVar64 = lVar64 + 0x40;
                      iVar61 = iVar61 + 0x10;
                    } while (iVar61 < (int)uVar48);
                    local_340 = lVar64 + local_50;
                    local_318 = local_58 + lVar64;
                    lVar53 = lVar64 + local_60;
                    local_240 = lVar64 + local_68;
                    local_248 = lVar64 + local_70;
                    local_108 = lVar64 + local_78;
                    lVar75 = lVar64 + local_80;
                    local_250 = lVar64 + local_88;
                    lVar39 = lVar64 + local_90;
                    lVar70 = lVar64 + local_98;
                    lVar78 = lVar64 + local_a0;
                    lVar40 = lVar64 + local_a8;
                    local_260 = local_b0 + lVar64;
                    local_258 = local_b8 + lVar64;
                    lVar58 = local_c0 + lVar64;
                    lVar64 = lVar64 + local_c8;
                    uVar49 = uVar48 & 0xfffffff0;
                  }
                  if ((int)uVar49 < (int)uVar48) {
                    lVar74 = 0;
                    do {
                      *(undefined4 *)*pauVar47 = *(undefined4 *)(local_340 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 4) = *(undefined4 *)(local_318 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 8) = *(undefined4 *)(lVar53 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0xc) =
                           *(undefined4 *)(local_240 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x10) =
                           *(undefined4 *)(local_248 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x14) =
                           *(undefined4 *)(local_108 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x18) = *(undefined4 *)(lVar75 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x1c) =
                           *(undefined4 *)(local_250 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x20) = *(undefined4 *)(lVar39 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x24) = *(undefined4 *)(lVar70 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x28) = *(undefined4 *)(lVar64 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x2c) = *(undefined4 *)(lVar58 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x30) =
                           *(undefined4 *)(local_258 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x34) =
                           *(undefined4 *)(local_260 + lVar74 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0x38) = *(undefined4 *)(lVar40 + lVar74 * 4)
                      ;
                      *(undefined4 *)((long)*pauVar47 + 0x3c) = *(undefined4 *)(lVar78 + lVar74 * 4)
                      ;
                      pauVar47 = pauVar47 + 1;
                      lVar74 = lVar74 + 1;
                    } while (uVar67 - uVar49 != (int)lVar74);
                  }
                  uVar51 = uVar41 + 0x10;
                  uVar69 = uVar41 + 0x1f;
                  lVar59 = lVar59 + local_40;
                  uVar41 = uVar51;
                  local_d0 = lVar36;
                } while (uVar69 < local_48);
              }
              if ((int)((uint)uVar51 | 7) < (int)uVar43) {
                local_248 = CONCAT44(local_248._4_4_,uVar48) & 0xfffffffffffffff8;
                uVar41 = uVar51 & 0xffffffff;
                lVar77 = local_328 + (local_188 + uVar41) * lVar36 * 4;
                local_240 = lVar36 * 0x20;
                lVar59 = local_328 + (local_190 + uVar41) * lVar36 * 4;
                local_350 = local_328 + (local_198 + uVar41) * lVar36 * 4;
                local_358 = local_328 + (local_1a0 + uVar41) * lVar36 * 4;
                local_310 = local_328 + (local_1d8 + uVar41) * lVar36 * 4;
                local_340 = local_328 + (local_1e0 + uVar41) * lVar36 * 4;
                local_318 = local_328 + (local_268 + uVar41) * lVar36 * 4;
                lVar53 = local_328 + (local_270 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar48 < 8) {
                    lVar75 = uVar76 * 4 + (uVar41 + lVar52) * lVar36 * 4;
                    lVar74 = uVar76 * 4 + (uVar41 + lVar52 + 1) * lVar36 * 4;
                    lVar64 = uVar76 * 4 + (uVar41 + lVar52 + 2) * lVar36 * 4;
                    lVar58 = uVar76 * 4 + (uVar41 + lVar52 + 3) * lVar36 * 4;
                    lVar40 = uVar76 * 4 + (uVar41 + lVar52 + 4) * lVar36 * 4;
                    lVar78 = uVar76 * 4 + (uVar41 + lVar52 + 5) * lVar36 * 4;
                    lVar70 = uVar76 * 4 + (uVar41 + lVar52 + 6) * lVar36 * 4;
                    lVar39 = uVar76 * 4 + (lVar52 + uVar41 + 7) * lVar36 * 4;
                    iVar61 = 0;
                  }
                  else {
                    iVar61 = 7;
                    lVar75 = 0;
                    pauVar28 = pauVar47;
                    do {
                      pauVar45 = pauVar28;
                      pauVar55 = (undefined1 (*) [32])((long)*pauVar47 + lVar75 * 2 * 4);
                      lVar39 = lVar75 + lVar53;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar75 + lVar53);
                      lVar70 = lVar36 * 8 + lVar39;
                      auVar106 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar39);
                      auVar108 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar39);
                      auVar3 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar70);
                      lVar39 = lVar36 * 8 + lVar70;
                      auVar4 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar70);
                      lVar70 = lVar36 * 4 + lVar39;
                      auVar109 = *(undefined1 (*) [32])
                                  ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar39);
                      auVar5 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 4 + lVar70);
                      auVar6 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar36 * 8 + lVar70);
                      auVar20 = vunpcklps_avx(auVar2,auVar106);
                      auVar106 = vunpckhps_avx(auVar2,auVar106);
                      auVar2 = vunpcklps_avx(auVar108,auVar3);
                      auVar108 = vunpckhps_avx(auVar108,auVar3);
                      auVar110 = vunpcklps_avx(auVar4,auVar109);
                      auVar3 = vunpckhps_avx(auVar4,auVar109);
                      auVar111 = vunpcklps_avx(auVar5,auVar6);
                      auVar4 = vunpckhps_avx(auVar5,auVar6);
                      auVar109 = vunpcklpd_avx(auVar20,auVar2);
                      auVar2 = vunpckhpd_avx(auVar20,auVar2);
                      auVar5 = vunpcklpd_avx(auVar106,auVar108);
                      auVar106 = vunpckhpd_avx(auVar106,auVar108);
                      auVar6 = vunpcklpd_avx(auVar110,auVar111);
                      auVar108 = vunpckhpd_avx(auVar110,auVar111);
                      auVar20 = vunpcklpd_avx(auVar3,auVar4);
                      auVar3 = vunpckhpd_avx(auVar3,auVar4);
                      auVar110._16_16_ = auVar6._0_16_;
                      auVar110._0_16_ = auVar109._0_16_;
                      auVar111._16_16_ = auVar108._0_16_;
                      auVar111._0_16_ = auVar2._0_16_;
                      auVar112._16_16_ = auVar20._0_16_;
                      auVar112._0_16_ = auVar5._0_16_;
                      auVar113._16_16_ = auVar3._0_16_;
                      auVar113._0_16_ = auVar106._0_16_;
                      auVar4 = vperm2f128_avx(auVar109,auVar6,0x31);
                      auVar2 = vperm2f128_avx(auVar2,auVar108,0x31);
                      auVar108 = vperm2f128_avx(auVar5,auVar20,0x31);
                      auVar106 = vperm2f128_avx(auVar106,auVar3,0x31);
                      *pauVar55 = auVar110;
                      pauVar55[1] = auVar111;
                      pauVar55[2] = auVar112;
                      pauVar55[3] = auVar113;
                      pauVar55[4] = auVar4;
                      pauVar55[5] = auVar2;
                      pauVar55[6] = auVar108;
                      pauVar55[7] = auVar106;
                      lVar75 = lVar75 + 0x20;
                      iVar61 = iVar61 + 8;
                      pauVar28 = (undefined1 (*) [64])(pauVar55 + 8);
                    } while (iVar61 < (int)uVar48);
                    pauVar47 = pauVar45 + 4;
                    lVar39 = lVar75 + lVar77;
                    lVar70 = lVar75 + lVar59;
                    lVar78 = lVar75 + local_350;
                    lVar40 = lVar75 + local_358;
                    lVar58 = lVar75 + local_310;
                    lVar64 = lVar75 + local_340;
                    lVar74 = lVar75 + local_318;
                    lVar75 = lVar75 + lVar53;
                    iVar61 = (int)local_248;
                  }
                  if (iVar61 < (int)uVar48) {
                    iVar61 = uVar67 - iVar61;
                    lVar54 = 0;
                    pauVar28 = pauVar47;
                    do {
                      pauVar45 = pauVar28;
                      puVar1 = (undefined4 *)((long)*pauVar47 + lVar54 * 2 * 4);
                      *puVar1 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar75);
                      puVar1[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar74);
                      puVar1[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar64);
                      puVar1[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar58);
                      puVar1[4] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar40);
                      puVar1[5] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar78);
                      puVar1[6] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar70);
                      puVar1[7] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar54 + lVar39);
                      lVar54 = lVar54 + 4;
                      iVar61 = iVar61 + -1;
                      pauVar28 = (undefined1 (*) [64])(puVar1 + 8);
                    } while (iVar61 != 0);
                    pauVar47 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
                  }
                  uVar51 = uVar41 + 8;
                  lVar75 = uVar41 + 0xf;
                  lVar77 = lVar77 + local_240;
                  lVar59 = lVar59 + local_240;
                  local_350 = local_350 + local_240;
                  local_358 = local_358 + local_240;
                  local_310 = local_310 + local_240;
                  local_340 = local_340 + local_240;
                  local_318 = local_318 + local_240;
                  lVar53 = lVar53 + local_240;
                  uVar41 = uVar51;
                } while (lVar75 < lVar35);
              }
              if ((int)((uint)uVar51 | 3) < (int)uVar43) {
                uVar41 = uVar51 & 0xffffffff;
                lVar77 = local_328 + (local_1d8 + uVar41) * lVar36 * 4;
                lVar39 = lVar36 * 0x10;
                lVar59 = local_328 + (local_1e0 + uVar41) * lVar36 * 4;
                lVar53 = local_328 + (local_268 + uVar41) * lVar36 * 4;
                lVar75 = local_328 + (local_270 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar48 < 8) {
                    uVar49 = 0;
                    lVar58 = uVar76 * 4 + (lVar52 + uVar41) * lVar36 * 4;
                    lVar40 = uVar76 * 4 + (lVar52 + uVar41 + 1) * lVar36 * 4;
                    lVar78 = uVar76 * 4 + (lVar52 + uVar41 + 2) * lVar36 * 4;
                    lVar70 = uVar76 * 4 + (lVar52 + uVar41 + 3) * lVar36 * 4;
                  }
                  else {
                    iVar61 = 7;
                    lVar58 = 0;
                    pauVar28 = pauVar47;
                    do {
                      pauVar45 = pauVar28;
                      pauVar55 = (undefined1 (*) [32])((long)*pauVar47 + lVar58 * 4);
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar58 + lVar75);
                      auVar106 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar58 + lVar53);
                      auVar108 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar58 + lVar59);
                      auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar58 + lVar77);
                      auVar4 = vunpcklps_avx(auVar2,auVar106);
                      auVar106 = vunpckhps_avx(auVar2,auVar106);
                      auVar2 = vunpcklps_avx(auVar108,auVar3);
                      auVar108 = vunpckhps_avx(auVar108,auVar3);
                      auVar3 = vunpcklpd_avx(auVar4,auVar2);
                      auVar2 = vunpckhpd_avx(auVar4,auVar2);
                      auVar4 = vunpcklpd_avx(auVar106,auVar108);
                      auVar106 = vunpckhpd_avx(auVar106,auVar108);
                      auVar108._16_16_ = auVar2._0_16_;
                      auVar108._0_16_ = auVar3._0_16_;
                      auVar109._16_16_ = auVar106._0_16_;
                      auVar109._0_16_ = auVar4._0_16_;
                      auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
                      auVar106 = vperm2f128_avx(auVar4,auVar106,0x31);
                      *pauVar55 = auVar108;
                      pauVar55[1] = auVar109;
                      pauVar55[2] = auVar2;
                      pauVar55[3] = auVar106;
                      lVar58 = lVar58 + 0x20;
                      iVar61 = iVar61 + 8;
                      pauVar28 = (undefined1 (*) [64])(pauVar55 + 4);
                    } while (iVar61 < (int)uVar48);
                    pauVar47 = pauVar45 + 2;
                    lVar70 = lVar58 + lVar77;
                    lVar78 = lVar58 + lVar59;
                    lVar40 = lVar58 + lVar53;
                    lVar58 = lVar58 + lVar75;
                    uVar49 = uVar48 & 0xfffffff8;
                  }
                  lVar78 = (long)pd._vptr_ParamDict + lVar78;
                  lVar70 = (long)pd._vptr_ParamDict + lVar70;
                  lVar58 = (long)pd._vptr_ParamDict + lVar58;
                  lVar40 = (long)pd._vptr_ParamDict + lVar40;
                  if ((int)(uVar49 | 3) < (int)uVar48) {
                    lVar64 = 0;
                    pauVar28 = pauVar47;
                    uVar50 = uVar49;
                    do {
                      pauVar45 = pauVar28;
                      auVar104 = vunpcklps_avx(*(undefined1 (*) [16])(lVar58 + lVar64),
                                               *(undefined1 (*) [16])(lVar40 + lVar64));
                      auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(lVar78 + lVar64),
                                              *(undefined1 (*) [16])(lVar70 + lVar64));
                      auVar21 = vunpckhps_avx(*(undefined1 (*) [16])(lVar58 + lVar64),
                                              *(undefined1 (*) [16])(lVar40 + lVar64));
                      auVar105 = vunpckhps_avx(*(undefined1 (*) [16])(lVar78 + lVar64),
                                               *(undefined1 (*) [16])(lVar70 + lVar64));
                      auVar107 = vunpcklpd_avx(auVar104,auVar19);
                      auVar104 = vunpckhpd_avx(auVar104,auVar19);
                      auVar19 = vunpcklpd_avx(auVar21,auVar105);
                      auVar21 = vunpckhpd_avx(auVar21,auVar105);
                      pauVar28 = (undefined1 (*) [64])((long)pauVar47[1] + lVar64 * 4);
                      *(undefined1 (*) [16])pauVar28[-1] = auVar107;
                      *(undefined1 (*) [16])((long)pauVar28[-1] + 0x10) = auVar104;
                      *(undefined1 (*) [16])((long)pauVar28[-1] + 0x20) = auVar19;
                      *(undefined1 (*) [16])((long)pauVar28[-1] + 0x30) = auVar21;
                      uVar49 = uVar50 + 4;
                      lVar64 = lVar64 + 0x10;
                      iVar61 = uVar50 + 7;
                      uVar50 = uVar49;
                    } while (iVar61 < (int)uVar48);
                    pauVar47 = pauVar45 + 1;
                    lVar70 = lVar70 + lVar64;
                    lVar78 = lVar78 + lVar64;
                    lVar40 = lVar40 + lVar64;
                    lVar58 = lVar58 + lVar64;
                  }
                  if ((int)uVar49 < (int)uVar48) {
                    lVar64 = 0;
                    do {
                      *(undefined4 *)*pauVar47 = *(undefined4 *)(lVar58 + lVar64 * 4);
                      *(undefined4 *)((long)*pauVar47 + 4) = *(undefined4 *)(lVar40 + lVar64 * 4);
                      *(undefined4 *)((long)*pauVar47 + 8) = *(undefined4 *)(lVar78 + lVar64 * 4);
                      *(undefined4 *)((long)*pauVar47 + 0xc) = *(undefined4 *)(lVar70 + lVar64 * 4);
                      pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
                      lVar64 = lVar64 + 1;
                    } while (uVar67 - uVar49 != (int)lVar64);
                  }
                  uVar51 = uVar41 + 4;
                  lVar70 = uVar41 + 7;
                  lVar77 = lVar77 + lVar39;
                  lVar59 = lVar59 + lVar39;
                  lVar53 = lVar53 + lVar39;
                  lVar75 = lVar75 + lVar39;
                  uVar41 = uVar51;
                } while (lVar70 < lVar35);
              }
              if ((int)((uint)uVar51 | 1) < (int)uVar43) {
                uVar41 = (ulong)(int)(uint)uVar51;
                lVar77 = local_328 + (local_268 + uVar41) * lVar36 * 4;
                lVar59 = local_328 + (local_270 + uVar41) * lVar36 * 4;
                do {
                  if ((int)uVar48 < 8) {
                    uVar49 = 0;
                    lVar75 = uVar76 * 4 + (uVar41 + lVar52) * lVar36 * 4;
                    lVar53 = uVar76 * 4 + (lVar52 + uVar41 + 1) * lVar36 * 4;
                  }
                  else {
                    iVar61 = 7;
                    lVar75 = 0;
                    pauVar28 = pauVar47;
                    do {
                      pauVar45 = pauVar28;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar75 + lVar59);
                      auVar106 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar75 + lVar77);
                      auVar108 = vunpcklps_avx(auVar2,auVar106);
                      auVar2 = vunpckhps_avx(auVar2,auVar106);
                      auVar106._16_16_ = auVar2._0_16_;
                      auVar106._0_16_ = auVar108._0_16_;
                      auVar2 = vperm2f128_avx(auVar108,auVar2,0x31);
                      pauVar55 = (undefined1 (*) [32])((long)*pauVar47 + lVar75 * 2);
                      *pauVar55 = auVar106;
                      pauVar55[1] = auVar2;
                      lVar75 = lVar75 + 0x20;
                      iVar61 = iVar61 + 8;
                      pauVar28 = (undefined1 (*) [64])(pauVar55 + 2);
                    } while (iVar61 < (int)uVar48);
                    pauVar47 = pauVar45 + 1;
                    lVar53 = lVar75 + lVar77;
                    lVar75 = lVar75 + lVar59;
                    uVar49 = uVar48 & 0xfffffff8;
                  }
                  pauVar62 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53);
                  pauVar60 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar75);
                  uVar50 = uVar49 | 3;
                  while ((int)uVar50 < (int)uVar48) {
                    auVar21 = vunpcklps_avx(*pauVar60,*pauVar62);
                    auVar104 = vunpckhps_avx(*pauVar60,*pauVar62);
                    *(undefined1 (*) [16])*pauVar47 = auVar21;
                    *(undefined1 (*) [16])((long)*pauVar47 + 0x10) = auVar104;
                    pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
                    pauVar60 = pauVar60 + 1;
                    pauVar62 = pauVar62 + 1;
                    uVar50 = uVar49 + 7;
                    uVar49 = uVar49 + 4;
                  }
                  if ((int)uVar49 < (int)uVar48) {
                    lVar53 = 0;
                    do {
                      *(undefined4 *)*pauVar47 = *(undefined4 *)(*pauVar60 + lVar53 * 4);
                      *(undefined4 *)((long)*pauVar47 + 4) = *(undefined4 *)(*pauVar62 + lVar53 * 4)
                      ;
                      pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 8);
                      lVar53 = lVar53 + 1;
                    } while (uVar67 - uVar49 != (int)lVar53);
                  }
                  uVar51 = uVar41 + 2;
                  lVar53 = uVar41 + 3;
                  lVar77 = lVar77 + lVar36 * 8;
                  lVar59 = lVar59 + lVar36 * 8;
                  uVar41 = uVar51;
                } while (lVar53 < lVar35);
              }
              if ((int)uVar51 < (int)uVar43) {
                lVar77 = (long)(int)uVar51;
                do {
                  pauVar55 = (undefined1 (*) [32])
                             ((long)pd._vptr_ParamDict + uVar76 * 4 + (lVar52 + lVar77) * lVar36 * 4
                             );
                  uVar49 = 0;
                  if (7 < (int)uVar48) {
                    iVar61 = 7;
                    do {
                      *(undefined1 (*) [32])*pauVar47 = *pauVar55;
                      pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
                      pauVar55 = pauVar55 + 1;
                      iVar61 = iVar61 + 8;
                      uVar49 = uVar48 & 0xfffffff8;
                    } while (iVar61 < (int)uVar48);
                  }
                  uVar50 = uVar49 | 3;
                  while ((int)uVar50 < (int)uVar48) {
                    *(undefined1 (*) [16])*pauVar47 = *(undefined1 (*) [16])*pauVar55;
                    pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
                    pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                    uVar50 = uVar49 + 7;
                    uVar49 = uVar49 + 4;
                  }
                  if ((int)uVar49 < (int)uVar48) {
                    lVar59 = 0;
                    do {
                      *(undefined4 *)*pauVar47 = *(undefined4 *)(*pauVar55 + lVar59 * 4);
                      pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 4);
                      lVar59 = lVar59 + 1;
                    } while (uVar67 - uVar49 != (int)lVar59);
                  }
                  lVar77 = lVar77 + 1;
                } while (lVar77 != lVar35);
              }
              uVar76 = uVar76 + local_110;
              local_328 = local_328 + local_e8;
              uVar32 = uVar32 - uVar57;
              local_d8 = uVar46;
            } while ((long)uVar76 < local_e0);
          }
          uVar46 = uVar46 + 1;
          local_1b0 = local_1b0 + local_f8;
          local_1a8 = local_1a8 + local_f8;
          local_118 = local_118 + local_f8;
          local_120 = local_120 + local_f8;
          local_128 = local_128 + local_f8;
          local_130 = local_130 + local_f8;
          local_138 = local_138 + local_f8;
          local_140 = local_140 + local_f8;
          local_148 = local_148 + local_f8;
          local_150 = local_150 + local_f8;
          local_158 = local_158 + local_f8;
          local_160 = local_160 + local_f8;
          local_168 = local_168 + local_f8;
          local_170 = local_170 + local_f8;
          local_178 = local_178 + local_f8;
          local_180 = local_180 + local_f8;
          local_188 = local_188 + local_1b8;
          local_190 = local_190 + local_1b8;
          local_198 = local_198 + local_1b8;
          local_1a0 = local_1a0 + local_1b8;
          local_1d8 = local_1d8 + local_1b8;
          local_1e0 = local_1e0 + local_1b8;
          local_268 = local_268 + local_1b8;
          local_270 = local_270 + local_1b8;
        } while (uVar46 != local_f0);
      }
      piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_2e8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_2e8->_vptr_Allocator[3])();
          }
        }
      }
      if (opt->lightmode == true) {
        piVar14 = (this->super_Convolution).weight_data.refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar15 = (this->super_Convolution).weight_data.data;
            pAVar16 = (this->super_Convolution).weight_data.allocator;
            if (pAVar16 == (Allocator *)0x0) {
              if (pvVar15 != (void *)0x0) {
                free(pvVar15);
              }
            }
            else {
              (*pAVar16->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&local_100->refcount + 4) = (undefined1  [16])0x0;
        local_100->data = (void *)0x0;
        local_100->refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
        return 0;
      }
      return 0;
    }
    uVar73 = uVar32 ^ 3;
    uVar56 = uVar67 ^ 3;
    uVar50 = uVar57 ^ 1;
    local_378 = uVar48 ^ 1;
    if (((((uVar43 == 0x10 && uVar71 == 1) && uVar73 == 0) && (uVar50 == 0 && uVar56 == 0)) &&
        ((uVar49 ^ 1) == 0 && (uVar48 ^ 1) == 0)) && iVar72 == 1) {
LAB_0017ce1b:
      convolution_transform_kernel_packed_sse
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar61,uVar7,uVar32,
                 uVar67,uVar43,uVar71);
    }
    else {
      bVar29 = uVar43 == 8 && (uVar71 ^ 8) == 0;
      if ((iVar72 == 1 &&
           ((uVar48 == 1 && uVar49 == 1) &&
           ((uVar67 == 3 && uVar57 == 1) && (uVar32 == 3 && bVar29)))) ||
         (((uVar48 == 1 && uVar49 == 1) && ((uVar67 == 2 && uVar57 == 1) && (bVar29 && uVar32 == 2))
          ) && iVar72 == 1)) goto LAB_0017ce1b;
      bVar29 = ((((uVar71 ^ 8) == 0 && (uVar43 ^ 1) == 0) && uVar73 == 0) &&
               (uVar50 == 0 && uVar56 == 0)) && local_378 == 0;
      if (((uVar49 == 1 && bVar29) && iVar72 == 1) ||
         (((bVar29 && uVar49 == 2) && iVar72 == 2 ||
          (((((uVar43 == 8 && uVar71 == 1) && uVar73 == 0) && (uVar50 == 0 && uVar56 == 0)) &&
           ((uVar49 ^ 1) == 0 && (uVar48 ^ 1) == 0)) && iVar72 == 1)))) goto LAB_0017ce1b;
      bVar29 = ((((uVar43 ^ 1) == 0 && uVar71 == 4) && uVar73 == 0) && (uVar50 == 0 && uVar56 == 0))
               && local_378 == 0;
      if (((uVar49 == 1 && bVar29) && iVar72 == 1) || (bVar29 && (uVar49 == 2 && iVar72 == 2)))
      goto LAB_0017ce1b;
      convolution_transform_kernel_packed
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar61,uVar7,uVar32,
                 uVar67);
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar14 = (this->super_Convolution).weight_data.refcount;
    if (piVar14 == (int *)0x0) goto LAB_0017d276;
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 != 0) goto LAB_0017d276;
    pvVar15 = (this->super_Convolution).weight_data.data;
    pAVar16 = (this->super_Convolution).weight_data.allocator;
  }
  if (pAVar16 == (Allocator *)0x0) {
    if (pvVar15 != (void *)0x0) {
      free(pvVar15);
    }
  }
  else {
    (*pAVar16->_vptr_Allocator[3])();
  }
LAB_0017d276:
  (this->super_Convolution).weight_data.cstep = 0;
  *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
       (undefined1  [16])0x0;
  (this->super_Convolution).weight_data.data = (void *)0x0;
  (this->super_Convolution).weight_data.refcount = (int *)0x0;
  (this->super_Convolution).weight_data.dims = 0;
  (this->super_Convolution).weight_data.w = 0;
  (this->super_Convolution).weight_data.h = 0;
  (this->super_Convolution).weight_data.d = 0;
  (this->super_Convolution).weight_data.c = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}